

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O1

bool __thiscall
density::detail::
LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
::Consume::is_queue_empty
          (Consume *this,
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          *i_queue)

{
  bool bVar1;
  
  bVar1 = empty(this);
  if (!bVar1) {
    density_tests::detail::assert_failed<>
              ("empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_multiple.h"
               ,0xc0);
  }
  begin_iteration(this,i_queue);
  while( true ) {
    bVar1 = empty(this);
    if ((bVar1) || ((this->m_next_ptr & 0xb) == 0)) break;
    move_next(this);
  }
  return bVar1;
}

Assistant:

bool is_queue_empty(LFQueue_Head * i_queue) noexcept
                {
                    DENSITY_ASSERT_INTERNAL(empty());

                    begin_iteration(i_queue);
                    while (!empty())
                    {
                        if (
                          (m_next_ptr & (LfQueue_Busy | LfQueue_Dead | LfQueue_InvalidNextPage)) ==
                          0)
                        {
                            return false;
                        }
                        move_next();
                    }
                    return true;
                }